

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

binary_op_t pugi::impl::anon_unknown_0::xpath_parser::binary_op_t::parse(xpath_lexer *lexer)

{
  binary_op_t bVar1;
  bool bVar2;
  lexeme_t lVar3;
  xpath_lexer_string *pxVar4;
  xpath_lexer *lexer_local;
  undefined4 uStack_10;
  int local_c;
  
  lVar3 = xpath_lexer::current(lexer);
  switch(lVar3) {
  case lex_equal:
    binary_op_t((binary_op_t *)((long)&lexer_local + 4),ast_op_equal,xpath_type_boolean,3);
    break;
  case lex_not_equal:
    binary_op_t((binary_op_t *)((long)&lexer_local + 4),ast_op_not_equal,xpath_type_boolean,3);
    break;
  case lex_less:
    binary_op_t((binary_op_t *)((long)&lexer_local + 4),ast_op_less,xpath_type_boolean,4);
    break;
  case lex_greater:
    binary_op_t((binary_op_t *)((long)&lexer_local + 4),ast_op_greater,xpath_type_boolean,4);
    break;
  case lex_less_or_equal:
    binary_op_t((binary_op_t *)((long)&lexer_local + 4),ast_op_less_or_equal,xpath_type_boolean,4);
    break;
  case lex_greater_or_equal:
    binary_op_t((binary_op_t *)((long)&lexer_local + 4),ast_op_greater_or_equal,xpath_type_boolean,4
               );
    break;
  case lex_plus:
    binary_op_t((binary_op_t *)((long)&lexer_local + 4),ast_op_add,xpath_type_number,5);
    break;
  case lex_minus:
    binary_op_t((binary_op_t *)((long)&lexer_local + 4),ast_op_subtract,xpath_type_number,5);
    break;
  case lex_multiply:
    binary_op_t((binary_op_t *)((long)&lexer_local + 4),ast_op_multiply,xpath_type_number,6);
    break;
  case lex_union:
    binary_op_t((binary_op_t *)((long)&lexer_local + 4),ast_op_union,xpath_type_node_set,7);
    break;
  default:
    binary_op_t((binary_op_t *)((long)&lexer_local + 4));
    break;
  case lex_string:
    pxVar4 = xpath_lexer::contents(lexer);
    bVar2 = xpath_lexer_string::operator==(pxVar4,"or");
    if (bVar2) {
      binary_op_t((binary_op_t *)((long)&lexer_local + 4),ast_op_or,xpath_type_boolean,1);
    }
    else {
      pxVar4 = xpath_lexer::contents(lexer);
      bVar2 = xpath_lexer_string::operator==(pxVar4,(char_t *)"and");
      if (bVar2) {
        binary_op_t((binary_op_t *)((long)&lexer_local + 4),ast_op_and,xpath_type_boolean,2);
      }
      else {
        pxVar4 = xpath_lexer::contents(lexer);
        bVar2 = xpath_lexer_string::operator==(pxVar4,(char_t *)"div");
        if (bVar2) {
          binary_op_t((binary_op_t *)((long)&lexer_local + 4),ast_op_divide,xpath_type_number,6);
        }
        else {
          pxVar4 = xpath_lexer::contents(lexer);
          bVar2 = xpath_lexer_string::operator==(pxVar4,(char_t *)"mod");
          if (bVar2) {
            binary_op_t((binary_op_t *)((long)&lexer_local + 4),ast_op_mod,xpath_type_number,6);
          }
          else {
            binary_op_t((binary_op_t *)((long)&lexer_local + 4));
          }
        }
      }
    }
  }
  bVar1.precedence = local_c;
  bVar1.asttype = lexer_local._4_4_;
  bVar1.rettype = uStack_10;
  return bVar1;
}

Assistant:

static binary_op_t parse(xpath_lexer& lexer)
			{
				switch (lexer.current())
				{
				case lex_string:
					if (lexer.contents() == PUGIXML_TEXT("or"))
						return binary_op_t(ast_op_or, xpath_type_boolean, 1);
					else if (lexer.contents() == PUGIXML_TEXT("and"))
						return binary_op_t(ast_op_and, xpath_type_boolean, 2);
					else if (lexer.contents() == PUGIXML_TEXT("div"))
						return binary_op_t(ast_op_divide, xpath_type_number, 6);
					else if (lexer.contents() == PUGIXML_TEXT("mod"))
						return binary_op_t(ast_op_mod, xpath_type_number, 6);
					else
						return binary_op_t();

				case lex_equal:
					return binary_op_t(ast_op_equal, xpath_type_boolean, 3);

				case lex_not_equal:
					return binary_op_t(ast_op_not_equal, xpath_type_boolean, 3);

				case lex_less:
					return binary_op_t(ast_op_less, xpath_type_boolean, 4);

				case lex_greater:
					return binary_op_t(ast_op_greater, xpath_type_boolean, 4);

				case lex_less_or_equal:
					return binary_op_t(ast_op_less_or_equal, xpath_type_boolean, 4);

				case lex_greater_or_equal:
					return binary_op_t(ast_op_greater_or_equal, xpath_type_boolean, 4);

				case lex_plus:
					return binary_op_t(ast_op_add, xpath_type_number, 5);

				case lex_minus:
					return binary_op_t(ast_op_subtract, xpath_type_number, 5);

				case lex_multiply:
					return binary_op_t(ast_op_multiply, xpath_type_number, 6);

				case lex_union:
					return binary_op_t(ast_op_union, xpath_type_node_set, 7);

				default:
					return binary_op_t();
				}
			}